

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O1

void __thiscall
SparseArray_Indices_Test<unsigned_int>::TestBody(SparseArray_Indices_Test<unsigned_int> *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char *message;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<int> values;
  const_iterator __first;
  unique_ptr<pstore::sparse_array<int,_unsigned_int>,_std::default_delete<pstore::sparse_array<int,_unsigned_int>_>_>
  arr;
  AssertionResult gtest_ar;
  vector<unsigned_long,_std::allocator<unsigned_long>_> actual;
  vector<unsigned_long,_std::allocator<unsigned_long>_> expected;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> indices;
  uint *local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  undefined8 uStack_c0;
  char local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  void *local_88;
  undefined8 uStack_80;
  long local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_38;
  
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000005;
  uStack_c0 = 7;
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_d8;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &local_38,__l,(less<unsigned_long> *)&local_88,(allocator_type *)&local_68);
  values._M_len = 0;
  values._M_array = (iterator)&local_38._M_impl.super__Rb_tree_header;
  pstore::sparse_array<int,unsigned_int>::make_unique<std::_Rb_tree_const_iterator<unsigned_long>>
            ((_Base_ptr)&local_e0,
             (_Rb_tree_const_iterator<unsigned_long>)
             local_38._M_impl.super__Rb_tree_header._M_header._M_left,values);
  uVar1 = *local_e0;
  local_88 = (void *)0x0;
  uStack_80 = 0;
  local_78 = 0;
  if ((ulong)uVar1 == 0) {
    uVar4 = 0;
    uVar3 = 0;
  }
  else {
    uVar2 = pstore::bit_count::ctz((ulong)uVar1);
    uVar3 = (ulong)(uVar1 >> ((byte)uVar2 & 0x1f));
    uVar4 = (ulong)uVar2;
  }
  __first.pos_ = uVar4;
  __first._0_8_ = uVar3;
  std::__copy_move<false,false,std::forward_iterator_tag>::
  __copy_m<pstore::sparse_array<int,unsigned_int>::indices::const_iterator,std::back_insert_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (__first,(const_iterator)ZEXT816(0),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88);
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000005;
  uStack_c0 = 7;
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_d8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_68,__l_00,(allocator_type *)&local_a0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_d8,&local_68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_50,&local_d8);
  if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_d8,&local_50);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_a0,&local_d8);
  if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  ::operator()(local_b0,(char *)&local_a0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)"actual");
  if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0[0] == '\0') {
    testing::Message::Message((Message *)&local_d8);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x11d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88 != (void *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  if (local_e0 != (uint *)0x0) {
    operator_delete(local_e0);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_38);
  return;
}

Assistant:

TYPED_TEST (SparseArray, Indices) {
    std::set<std::size_t> indices{2, 3, 5, 7};
    auto arr =
        sparse_array<int, TypeParam>::make_unique (std::begin (indices), std::end (indices), {});

    typename sparse_array<int, TypeParam>::indices idc{*arr};
    std::vector<std::size_t> actual;
    std::copy (std::begin (idc), std::end (idc), std::back_inserter (actual));
    std::vector<std::size_t> const expected{2, 3, 5, 7};
    EXPECT_THAT (actual, ::testing::ContainerEq (expected));
}